

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Connection::handleSETTINGS(QHttp2Connection *this)

{
  QLoggingCategory **ppQVar1;
  bool bVar2;
  quint32 qVar3;
  Frame *in_RDI;
  long in_FS_OFFSET;
  quint32 intVal;
  Settings identifier;
  uchar *end;
  uchar *src;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_fffffffffffffef8;
  FrameFlag in_stack_fffffffffffffeff;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  unsigned_short in_stack_ffffffffffffff16;
  char *in_stack_ffffffffffffff20;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *pQVar4;
  Frame *pFVar5;
  Http2Error errorCode;
  QHttp2Connection *in_stack_ffffffffffffff30;
  Settings in_stack_ffffffffffffff46;
  QHttp2Connection *in_stack_ffffffffffffff48;
  char local_b0 [32];
  char local_90 [32];
  char local_70 [36];
  QFlagsStorageHelper<Http2::FrameFlag,_4> local_4c;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar5 = in_RDI;
  qVar3 = Http2::Frame::streamID((Frame *)0x2b8057);
  errorCode = (Http2Error)((ulong)pFVar5 >> 0x20);
  if (qVar3 == 0) {
    local_4c.super_QFlagsStorage<Http2::FrameFlag>.i =
         (QFlagsStorage<Http2::FrameFlag>)Http2::Frame::flags((Frame *)in_stack_ffffffffffffff00);
    bVar2 = QFlags<Http2::FrameFlag>::testFlag
                      ((QFlags<Http2::FrameFlag> *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffeff);
    if (bVar2) {
      qVar3 = Http2::Frame::payloadSize((Frame *)in_stack_ffffffffffffff00);
      if (qVar3 == 0) {
        if (((ulong)(in_RDI->buffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage & 0x100000000) == 0) {
          connectionError(in_stack_ffffffffffffff30,errorCode,in_stack_ffffffffffffff20);
        }
        else {
          local_18 = 0xaaaaaaaaaaaaaaaa;
          local_10 = 0xaaaaaaaaaaaaaaaa;
          qHttp2ConnectionLog();
          anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    (in_stack_ffffffffffffff00,
                     (QLoggingCategory *)
                     CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
            anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b8154);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                       (char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                       (char *)0x2b816d);
            QMessageLogger::debug(local_70,"[%p] Received SETTINGS ACK",in_RDI);
            local_10 = local_10 & 0xffffffffffffff00;
          }
          *(undefined1 *)
           ((long)&(in_RDI->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = 0;
        }
      }
      else {
        connectionError(in_stack_ffffffffffffff30,errorCode,in_stack_ffffffffffffff20);
      }
    }
    else {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      qHttp2ConnectionLog();
      anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_stack_ffffffffffffff00,
                 (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
        anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b81f3);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)
                   CONCAT26(in_stack_ffffffffffffff16,
                            CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                   (char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                   (char *)0x2b8209);
        QMessageLogger::debug(local_90,"[%p] Received SETTINGS frame",in_RDI);
        local_20 = local_20 & 0xffffffffffffff00;
      }
      qVar3 = Http2::Frame::dataSize
                        ((Frame *)CONCAT26(in_stack_ffffffffffffff16,
                                           CONCAT24(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10)));
      if (qVar3 != 0) {
        in_stack_ffffffffffffff00 =
             (QLoggingCategoryMacroHolder<(QtMsgType)0> *)Http2::Frame::dataBegin(in_RDI);
        pQVar4 = in_stack_ffffffffffffff00;
        qVar3 = Http2::Frame::dataSize
                          ((Frame *)CONCAT26(in_stack_ffffffffffffff16,
                                             CONCAT24(in_stack_ffffffffffffff14,
                                                      in_stack_ffffffffffffff10)));
        ppQVar1 = &in_stack_ffffffffffffff00->category;
        for (; pQVar4 != (QLoggingCategoryMacroHolder<(QtMsgType)0> *)((long)ppQVar1 + (ulong)qVar3)
            ; pQVar4 = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)((long)&pQVar4->category + 6)) {
          in_stack_ffffffffffffff16 = qFromBigEndian<unsigned_short>(in_stack_ffffffffffffff00);
          in_stack_ffffffffffffff10 = qFromBigEndian<unsigned_int>(in_stack_ffffffffffffff00);
          bVar2 = acceptSetting(in_stack_ffffffffffffff48,in_stack_ffffffffffffff46,
                                qt_category_2._12_4_);
          if (!bVar2) {
            local_38 = 0xaaaaaaaaaaaaaaaa;
            local_30 = 0xaaaaaaaaaaaaaaaa;
            qHttp2ConnectionLog();
            anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      (in_stack_ffffffffffffff00,
                       (QLoggingCategory *)
                       CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
            while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
              anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b8329);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)
                         CONCAT26(in_stack_ffffffffffffff16,
                                  CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                         (char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                         (char *)0x2b833f);
              QMessageLogger::debug
                        (local_b0,"[%p] Received an unacceptable setting, %u, %u",in_RDI,
                         (ulong)in_stack_ffffffffffffff16,(ulong)in_stack_ffffffffffffff10);
              local_30 = local_30 & 0xffffffffffffff00;
            }
            goto LAB_002b8426;
          }
        }
      }
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      qHttp2ConnectionLog();
      anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_stack_ffffffffffffff00,
                 (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_48), bVar2) {
        anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b83da);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)
                   CONCAT26(in_stack_ffffffffffffff16,
                            CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                   (char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                   (char *)0x2b83f0);
        QMessageLogger::debug(&stack0xffffffffffffff30,"[%p] Sending SETTINGS ACK",in_RDI);
        local_40 = local_40 & 0xffffffffffffff00;
      }
      sendSETTINGS_ACK((QHttp2Connection *)
                       CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)));
      settingsFrameReceived((QHttp2Connection *)0x2b8426);
    }
  }
  else {
    connectionError(in_stack_ffffffffffffff30,errorCode,in_stack_ffffffffffffff20);
  }
LAB_002b8426:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::handleSETTINGS()
{
    // 6.5 SETTINGS.
    Q_ASSERT(inboundFrame.type() == FrameType::SETTINGS);

    // RFC 9113, 6.5: If an endpoint receives a SETTINGS frame whose Stream Identifier field is
    // anything other than 0x00, the endpoint MUST respond with a connection error
    if (inboundFrame.streamID() != connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "SETTINGS on invalid stream");

    if (inboundFrame.flags().testFlag(FrameFlag::ACK)) {
        // RFC 9113, 6.5: Receipt of a SETTINGS frame with the ACK flag set and a length field
        // value other than 0 MUST be treated as a connection error
        if (inboundFrame.payloadSize ())
            return connectionError(FRAME_SIZE_ERROR, "SETTINGS ACK with data");
        if (!waitingForSettingsACK)
            return connectionError(PROTOCOL_ERROR, "unexpected SETTINGS ACK");
        qCDebug(qHttp2ConnectionLog, "[%p] Received SETTINGS ACK", this);
        waitingForSettingsACK = false;
        return;
    }
    qCDebug(qHttp2ConnectionLog, "[%p] Received SETTINGS frame", this);

    if (inboundFrame.dataSize()) {
        // RFC 9113, 6.5: A SETTINGS frame with a length other than a multiple of 6 octets MUST be
        // treated as a connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
        // checked in Frame::validateHeader()
        Q_ASSERT (inboundFrame.payloadSize() % 6 == 0);

        auto src = inboundFrame.dataBegin();
        for (const uchar *end = src + inboundFrame.dataSize(); src != end; src += 6) {
            const Settings identifier = Settings(qFromBigEndian<quint16>(src));
            const quint32 intVal = qFromBigEndian<quint32>(src + 2);
            if (!acceptSetting(identifier, intVal)) {
                // If not accepted - we finish with connectionError.
                qCDebug(qHttp2ConnectionLog, "[%p] Received an unacceptable setting, %u, %u", this,
                        quint32(identifier), intVal);
                return; // connectionError already called in acceptSetting.
            }
        }
    }

    qCDebug(qHttp2ConnectionLog, "[%p] Sending SETTINGS ACK", this);
    sendSETTINGS_ACK();
    emit settingsFrameReceived();
}